

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

int xmlSaveSwitchEncoding(xmlSaveCtxtPtr ctxt,char *encoding)

{
  xmlOutputBufferPtr output;
  xmlCharEncodingHandlerPtr pxVar1;
  xmlBufPtr pxVar2;
  int iVar3;
  
  iVar3 = 0;
  if (((encoding != (char *)0x0) &&
      (output = ctxt->buf, output->encoder == (xmlCharEncodingHandlerPtr)0x0)) &&
     (iVar3 = 0, output->conv == (xmlBufPtr)0x0)) {
    pxVar1 = xmlFindCharEncodingHandler(encoding);
    output->encoder = pxVar1;
    if (pxVar1 == (xmlCharEncodingHandlerPtr)0x0) {
      xmlSaveErr(0x57b,(xmlNodePtr)0x0,encoding);
    }
    else {
      pxVar2 = xmlBufCreate();
      output->conv = pxVar2;
      if (pxVar2 != (xmlBufPtr)0x0) {
        xmlCharEncOutput(output,1);
        return 0;
      }
      xmlCharEncCloseFunc(output->encoder);
      xmlSaveErrMemory("creating encoding buffer");
    }
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int xmlSaveSwitchEncoding(xmlSaveCtxtPtr ctxt, const char *encoding) {
    xmlOutputBufferPtr buf = ctxt->buf;

    if ((encoding != NULL) && (buf->encoder == NULL) && (buf->conv == NULL)) {
	buf->encoder = xmlFindCharEncodingHandler((const char *)encoding);
	if (buf->encoder == NULL) {
	    xmlSaveErr(XML_SAVE_UNKNOWN_ENCODING, NULL,
		       (const char *)encoding);
	    return(-1);
	}
	buf->conv = xmlBufCreate();
	if (buf->conv == NULL) {
	    xmlCharEncCloseFunc(buf->encoder);
	    xmlSaveErrMemory("creating encoding buffer");
	    return(-1);
	}
	/*
	 * initialize the state, e.g. if outputting a BOM
	 */
        xmlCharEncOutput(buf, 1);
    }
    return(0);
}